

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_fasta.cpp
# Opt level: O2

bool __thiscall BamTools::Fasta::FastaPrivate::GetNextHeader(FastaPrivate *this,string *header)

{
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  stringstream headerBuffer;
  char buffer [1024];
  string local_5c0 [32];
  stringstream local_5a0 [16];
  ostream local_590 [376];
  char local_418 [1032];
  
  if ((this->IsOpen == true) && (iVar1 = feof((FILE *)this->Stream), iVar1 == 0)) {
    pcVar2 = fgets(local_418,0x400,(FILE *)this->Stream);
    if (pcVar2 == (char *)0x0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"FASTA error : could not read from file");
    }
    else {
      if (local_418[0] == '>') {
        std::__cxx11::stringstream::stringstream(local_5a0);
        std::operator<<(local_590,local_418);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)header,local_5c0);
        std::__cxx11::string::~string(local_5c0);
        std::__cxx11::stringstream::~stringstream(local_5a0);
        return true;
      }
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "FASTA error : expected header (\'>\'), instead : ");
      poVar3 = std::operator<<(poVar3,local_418[0]);
    }
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  return false;
}

Assistant:

bool Fasta::FastaPrivate::GetNextHeader(std::string& header)
{

    // validate input stream
    if (!IsOpen || feof(Stream)) return false;

    // read in header line
    char buffer[1024];
    if (fgets(buffer, 1024, Stream) == 0) {
        std::cerr << "FASTA error : could not read from file" << std::endl;
        return false;
    }

    // make sure it's a FASTA header
    if (buffer[0] != '>') {
        std::cerr << "FASTA error : expected header ('>'), instead : " << buffer[0] << std::endl;
        return false;
    }

    // import buffer contents to header string
    std::stringstream headerBuffer;
    headerBuffer << buffer;
    header = headerBuffer.str();

    // return success
    return true;
}